

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceGroup * __thiscall cmMakefile::GetOrCreateSourceGroup(cmMakefile *this,string *name)

{
  cmValue cVar1;
  cmSourceGroup *pcVar2;
  string_view sep;
  string_view str;
  string delimiters;
  string local_68;
  char *local_48;
  char *local_40;
  char local_38;
  undefined7 uStack_37;
  
  local_40 = (char *)0x0;
  local_38 = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"SOURCE_GROUP_DELIMITER","");
  cVar1 = GetDefinition(this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (cVar1.Value == (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,local_40,0x804604);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_48);
  }
  sep._M_str = local_48;
  sep._M_len = (size_t)local_40;
  str._M_str = (name->_M_dataplus)._M_p;
  str._M_len = name->_M_string_length;
  cmTokenize_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,str,sep);
  pcVar2 = GetOrCreateSourceGroup
                     (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return pcVar2;
}

Assistant:

cmSourceGroup* cmMakefile::GetOrCreateSourceGroup(const std::string& name)
{
  std::string delimiters;
  if (cmValue p = this->GetDefinition("SOURCE_GROUP_DELIMITER")) {
    delimiters = *p;
  } else {
    delimiters = "/\\";
  }
  return this->GetOrCreateSourceGroup(cmTokenize(name, delimiters));
}